

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg.cpp
# Opt level: O2

bool mg::data::mrg_read(string *hed,string *mrg,Mrg *out)

{
  pointer pcVar1;
  ulong uVar2;
  int iVar3;
  pointer pcVar4;
  ulong uVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string *local_40;
  ulong local_38;
  
  local_38 = hed->_M_string_length;
  local_40 = mrg;
  if ((local_38 & 7) == 0) {
    uVar5 = local_38 >> 3;
    pcVar1 = (hed->_M_dataplus)._M_p;
    std::vector<mg::data::Mrg::Entry,_std::allocator<mg::data::Mrg::Entry>_>::clear(&out->entries);
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      uVar2 = *(ulong *)(pcVar1 + uVar6 * 8);
      iVar3 = (int)uVar2;
      if (iVar3 == -1) break;
      pcVar4 = (local_40->_M_dataplus)._M_p + (uint)(iVar3 << 0xb);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,pcVar4,pcVar4 + ((uint)(uVar2 >> 0x15) & 0x7fff800));
      std::vector<mg::data::Mrg::Entry,std::allocator<mg::data::Mrg::Entry>>::
      emplace_back<std::__cxx11::string>
                ((vector<mg::data::Mrg::Entry,std::allocator<mg::data::Mrg::Entry>> *)out,&local_60)
      ;
      std::__cxx11::string::~string((string *)&local_60);
    }
  }
  else {
    fprintf(_stderr,"Wrong size for HED, must be multiple of %lu\n",8);
  }
  return (local_38 & 7) == 0;
}

Assistant:

bool mrg_read(const std::string &hed, const std::string &mrg, Mrg &out) {
  if (hed.size() % sizeof(Mrg::PackedEntryHeader) != 0) {
    fprintf(stderr, "Wrong size for HED, must be multiple of %lu\n",
            sizeof(Mrg::PackedEntryHeader));
    return false;
  }

  // Reinterpret header
  const ssize_t entry_count = hed.size() / sizeof(Mrg::PackedEntryHeader);
  const Mrg::PackedEntryHeader *raw_entries =
      reinterpret_cast<const Mrg::PackedEntryHeader *>(hed.data());

  // Parse off each entry
  out.entries.clear();
  for (ssize_t i = 0; i < entry_count; i++) {
    // Copy current header
    Mrg::PackedEntryHeader header = raw_entries[i];

    // Endian swap to host
    header.to_host_order();

    // Is this EOF?
    if (header.offset == 0xFFFF'FFFF) {
      break;
    }

    // Excise the source data at the specified offset + len
    out.entries.emplace_back(
        std::string(&mrg[header.offset * Mrg::SECTOR_SIZE],
                    header.size_sectors * Mrg::SECTOR_SIZE));
  }

  return true;
}